

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaeger_types.cpp
# Opt level: O3

ssize_t __thiscall jaegertracing::thrift::Log::read(Log *this,int __fd,void *__buf,size_t __nbytes)

{
  vector<jaegertracing::thrift::Tag,_std::allocator<jaegertracing::thrift::Tag>_> *this_00;
  pointer pTVar1;
  pointer pTVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 *puVar6;
  ulong uVar7;
  undefined4 in_register_00000034;
  TProtocol *this_01;
  pointer pTVar8;
  long lVar9;
  uint32_t _size3;
  int16_t fid;
  TType ftype;
  string fname;
  TType _etype6;
  uint local_84;
  short local_7e;
  int local_7c;
  undefined8 local_78;
  undefined8 local_70;
  Log *local_68;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50 [16];
  int64_t *local_40;
  undefined1 local_34 [4];
  
  this_01 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_01);
  local_60 = local_50;
  local_58 = 0;
  local_50[0] = 0;
  iVar3 = (*this_01->_vptr_TProtocol[0x19])(this_01,&local_60);
  this_00 = &this->fields;
  local_40 = &this->timestamp;
  local_70 = 0;
  local_78 = 0;
  local_68 = this;
  do {
    iVar4 = (*this_01->_vptr_TProtocol[0x1b])(this_01,&local_60,&local_7c,&local_7e);
    iVar4 = iVar4 + iVar3;
    if (local_7c == 0) {
      iVar3 = (*this_01->_vptr_TProtocol[0x1a])(this_01);
      if (((byte)local_70 & (byte)local_78 & 1) == 0) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
        puVar6[1] = puVar6 + 3;
        puVar6[2] = 0;
        *(undefined1 *)(puVar6 + 3) = 0;
        *puVar6 = &PTR__TException_00272740;
        *(undefined4 *)(puVar6 + 5) = 1;
        __cxa_throw(puVar6,&apache::thrift::protocol::TProtocolException::typeinfo,
                    apache::thrift::TException::~TException);
      }
      if (local_60 != local_50) {
        operator_delete(local_60);
      }
      this_01->input_recursion_depth_ = this_01->input_recursion_depth_ - 1;
      return (ulong)(uint)(iVar3 + iVar4);
    }
    if (local_7e == 2) {
      if (local_7c != 0xf) {
        iVar3 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
        goto LAB_0020d112;
      }
      pTVar1 = (this->fields).
               super__Vector_base<jaegertracing::thrift::Tag,_std::allocator<jaegertracing::thrift::Tag>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pTVar2 = (this->fields).
               super__Vector_base<jaegertracing::thrift::Tag,_std::allocator<jaegertracing::thrift::Tag>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pTVar8 = pTVar1;
      if (pTVar2 != pTVar1) {
        do {
          (*(code *)**(undefined8 **)pTVar8)(pTVar8);
          pTVar8 = pTVar8 + 1;
        } while (pTVar8 != pTVar2);
        (local_68->fields).
        super__Vector_base<jaegertracing::thrift::Tag,_std::allocator<jaegertracing::thrift::Tag>_>.
        _M_impl.super__Vector_impl_data._M_finish = pTVar1;
      }
      iVar3 = (*this_01->_vptr_TProtocol[0x1f])(this_01,local_34,&local_84);
      std::vector<jaegertracing::thrift::Tag,_std::allocator<jaegertracing::thrift::Tag>_>::resize
                (this_00,(ulong)local_84);
      this = local_68;
      iVar3 = iVar3 + iVar4;
      if (local_84 != 0) {
        lVar9 = 0;
        uVar7 = 0;
        do {
          pTVar1 = (this_00->
                   super__Vector_base<jaegertracing::thrift::Tag,_std::allocator<jaegertracing::thrift::Tag>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          iVar4 = (**(code **)(*(long *)(&pTVar1->field_0x0 + lVar9) + 0x10))
                            (&pTVar1->field_0x0 + lVar9,this_01);
          iVar3 = iVar3 + iVar4;
          uVar7 = uVar7 + 1;
          lVar9 = lVar9 + 0x90;
        } while (uVar7 < local_84);
      }
      iVar5 = (*this_01->_vptr_TProtocol[0x20])(this_01);
      iVar4 = iVar5 + iVar3;
      local_78 = CONCAT71((int7)(CONCAT44(extraout_var_00,iVar5) >> 8),1);
    }
    else {
      if (local_7e == 1) {
        if (local_7c == 10) {
          iVar3 = (*this_01->_vptr_TProtocol[0x28])(this_01,local_40);
          iVar4 = iVar3 + iVar4;
          local_70 = CONCAT71((int7)(CONCAT44(extraout_var,iVar3) >> 8),1);
          goto LAB_0020d117;
        }
        iVar3 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
      }
      else {
        iVar3 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
      }
LAB_0020d112:
      iVar4 = iVar3 + iVar4;
    }
LAB_0020d117:
    iVar3 = (*this_01->_vptr_TProtocol[0x1c])(this_01);
    iVar3 = iVar3 + iVar4;
  } while( true );
}

Assistant:

uint32_t Log::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_timestamp = false;
  bool isset_fields = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->timestamp);
          isset_timestamp = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->fields.clear();
            uint32_t _size3;
            ::apache::thrift::protocol::TType _etype6;
            xfer += iprot->readListBegin(_etype6, _size3);
            this->fields.resize(_size3);
            uint32_t _i7;
            for (_i7 = 0; _i7 < _size3; ++_i7)
            {
              xfer += this->fields[_i7].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          isset_fields = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_timestamp)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_fields)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}